

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_jump_level(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  char local_b8 [8];
  char s [80];
  char prompt [80];
  wchar_t choose_gen;
  wchar_t level;
  command_conflict *cmd_local;
  
  wVar2 = cmd_get_arg_number((command *)cmd,"level",(int *)(prompt + 0x4c));
  if (wVar2 != L'\0') {
    strnfmt(s + 0x48,0x50,"Jump to level (0-%d): ",(ulong)(z_info->max_depth - 1));
    strnfmt(local_b8,0x50,"%d",(ulong)(uint)(int)player->depth);
    _Var1 = get_string(s + 0x48,local_b8,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(local_b8,(int *)(prompt + 0x4c));
    if (!_Var1) {
      return;
    }
    cmd_set_arg_number((command *)cmd,"level",prompt._76_4_);
  }
  if ((-1 < (int)prompt._76_4_) && ((int)prompt._76_4_ < (int)(uint)z_info->max_depth)) {
    wVar2 = cmd_get_arg_choice((command *)cmd,"choice",(int *)(prompt + 0x48));
    if (wVar2 != L'\0') {
      _Var1 = get_check("Choose cave profile? ");
      prompt._72_4_ = ZEXT14(_Var1);
      cmd_set_arg_choice((command *)cmd,"choice",prompt._72_4_);
    }
    if (prompt._72_4_ != 0) {
      player->noscore = player->noscore | 0x10;
    }
    msg("You jump to dungeon level %d.",(ulong)(uint)prompt._76_4_);
    dungeon_change_level(player,prompt._76_4_);
    player->upkeep->energy_use = (uint)z_info->move_energy;
  }
  return;
}

Assistant:

void do_cmd_wiz_jump_level(struct command *cmd)
{
	int level, choose_gen;

	if (cmd_get_arg_number(cmd, "level", &level) != CMD_OK) {
		char prompt[80], s[80];

		strnfmt(prompt, sizeof(prompt), "Jump to level (0-%d): ",
			z_info->max_depth - 1);

		/* Set default */
		strnfmt(s, sizeof(s), "%d", player->depth);

		if (!get_string(prompt, s, sizeof(s))) return;
		if (!get_int_from_string(s, &level)) return;
		cmd_set_arg_number(cmd, "level", level);
	}

	/* Paranoia */
	if (level < 0 || level >= z_info->max_depth) return;

	if (cmd_get_arg_choice(cmd, "choice", &choose_gen) != CMD_OK) {
		choose_gen = (get_check("Choose cave profile? ")) ? 1 : 0;
		cmd_set_arg_choice(cmd, "choice", choose_gen);
	}

	if (choose_gen) {
		player->noscore |= NOSCORE_JUMPING;
	}

	msg("You jump to dungeon level %d.", level);
	dungeon_change_level(player, level);

	/*
	 * Because of the structure of the game loop, need to take some energy,
	 * or the change level request will not be processed until after
	 * performing another action that takes energy.
	 */
	player->upkeep->energy_use = z_info->move_energy;
}